

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

QByteArray * QTzTimeZonePrivate::staticSystemTimeZoneId(void)

{
  storage_type_conflict *psVar1;
  QArrayData *pQVar2;
  char *pcVar3;
  char16_t *pcVar4;
  undefined1 *puVar5;
  Data *pDVar6;
  Data *pDVar7;
  Data *data_00;
  bool bVar8;
  int iVar9;
  uint uVar10;
  long *plVar11;
  int *piVar12;
  long lVar13;
  ulong uVar15;
  long lVar16;
  QArrayData *pQVar17;
  QArrayData *pQVar18;
  char *pcVar19;
  char *pcVar20;
  QByteArray *in_RDI;
  char *pcVar21;
  QArrayData *pQVar22;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QStringView string;
  QStringView string_00;
  stat64 data;
  QByteArray local_128;
  QString local_108;
  QString local_e8;
  stat64 local_c8;
  long local_38;
  qsizetype qVar14;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv(in_RDI,"TZ");
  local_c8.st_dev = 0x5ad6ba;
  bVar8 = ::operator==(in_RDI,(char **)&local_c8);
  if (bVar8) {
    QByteArray::clear(in_RDI);
  }
  else {
    lVar16 = (in_RDI->d).size;
    if ((lVar16 != 0) && (*(in_RDI->d).ptr == ':')) {
      QByteArray::QByteArray((QByteArray *)&local_c8,(in_RDI->d).ptr + 1,lVar16 + -1);
      pQVar17 = &((in_RDI->d).d)->super_QArrayData;
      pcVar20 = (in_RDI->d).ptr;
      (in_RDI->d).d = (Data *)local_c8.st_dev;
      (in_RDI->d).ptr = (char *)local_c8.st_ino;
      puVar5 = (undefined1 *)(in_RDI->d).size;
      (in_RDI->d).size = local_c8.st_nlink;
      local_c8.st_dev = (__dev_t)pQVar17;
      local_c8.st_ino = (__ino64_t)pcVar20;
      local_c8.st_nlink = (__nlink_t)puVar5;
      if (pQVar17 != (QArrayData *)0x0) {
        LOCK();
        (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar17->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar17,1,0x10);
        }
      }
    }
  }
  if ((in_RDI->d).size != 0) goto LAB_004075af;
  plVar11 = (long *)__tls_get_addr(&PTR_006ba338);
  if (*(char *)((long)plVar11 + 0x99) == '\0') {
    staticSystemTimeZoneId();
  }
  memset(&local_c8,0xaa,0x90);
  iVar9 = stat64("/etc/localtime",&local_c8);
  pQVar17 = (QArrayData *)0xffffffffffffffff;
  pcVar20 = (char *)0xffffffffffffffff;
  if (iVar9 != -1) {
    pQVar17 = (QArrayData *)local_c8.st_dev;
    pcVar20 = (char *)local_c8.st_ino;
  }
  memset(&local_c8,0xaa,0x90);
  iVar9 = stat64("/etc/TZ",&local_c8);
  pQVar18 = (QArrayData *)0xffffffffffffffff;
  pcVar19 = (char *)0xffffffffffffffff;
  if (iVar9 != -1) {
    pQVar18 = (QArrayData *)local_c8.st_dev;
    pcVar19 = (char *)local_c8.st_ino;
  }
  memset(&local_c8,0xaa,0x90);
  iVar9 = stat64("/etc/timezone",&local_c8);
  pcVar21 = (char *)0xffffffffffffffff;
  pQVar22 = (QArrayData *)0xffffffffffffffff;
  if (iVar9 != -1) {
    pcVar21 = (char *)local_c8.st_ino;
    pQVar22 = (QArrayData *)local_c8.st_dev;
  }
  lVar16 = plVar11[2];
  if (lVar16 == 0) {
LAB_0040775b:
    local_c8.st_nlink = (__nlink_t)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.st_dev = (__dev_t)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.st_ino = (__ino64_t)&DAT_aaaaaaaaaaaaaaaa;
    qEnvironmentVariable((QString *)&local_c8,"TZDIR");
    local_e8.d.d = (Data *)0x0;
    local_e8.d.ptr = L"/etc/localtime";
    local_e8.d.size = 0xe;
    piVar12 = __errno_location();
    *piVar12 = 0;
    lVar13 = sysconf(0xad);
    lVar16 = 0x14;
    if (-1 < lVar13) {
      lVar16 = lVar13;
    }
    do {
      QFile::symLinkTarget(&local_108,&local_e8);
      pcVar4 = local_e8.d.ptr;
      data_00 = local_e8.d.d;
      qVar14 = local_108.d.size;
      pDVar7 = local_108.d.d;
      local_108.d.d = local_e8.d.d;
      local_e8.d.d = pDVar7;
      local_e8.d.ptr = local_108.d.ptr;
      local_108.d.ptr = pcVar4;
      local_108.d.size = local_e8.d.size;
      local_e8.d.size = qVar14;
      if (&data_00->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (data_00->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (data_00->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data_00->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&data_00->super_QArrayData,2,0x10);
        }
      }
      if ((undefined1 *)local_c8.st_nlink == (undefined1 *)0x0) {
        uVar10 = 0xffffffff;
      }
      else {
        qVar14 = QString::indexOf(&local_e8,(QString *)&local_c8,0,CaseSensitive);
        uVar10 = (uint)qVar14;
      }
      if (-1 < (int)uVar10) {
        local_108.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_108.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_108.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        string.m_size = local_e8.d.ptr + (long)(local_c8.st_nlink + (uVar10 & 0x7fffffff));
        string.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        QtPrivate::convertToUtf8
                  ((QByteArray *)&local_108,
                   (QtPrivate *)
                   (local_e8.d.size + -(long)(local_c8.st_nlink + (uVar10 & 0x7fffffff))),string);
        if (((undefined1 *)local_108.d.size == (undefined1 *)0x0) || ((char)*local_108.d.ptr != '/')
           ) {
          local_128.d.d = (Data *)local_108.d.d;
          local_128.d.ptr = (char *)local_108.d.ptr;
          local_128.d.size = local_108.d.size;
          if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
            ;
            UNLOCK();
          }
        }
        else {
          QByteArray::QByteArray
                    (&local_128,(char *)((long)local_108.d.ptr + 1),
                     (qsizetype)(local_108.d.size + -1));
        }
        if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,1,0x10);
          }
        }
        goto LAB_00407992;
      }
      str.m_data = "/zoneinfo/";
      str.m_size = 10;
      qVar14 = QString::indexOf(&local_e8,str,0,CaseSensitive);
      if (-1 < (int)(uint)qVar14) {
        uVar15 = (ulong)((uint)qVar14 & 0x7fffffff);
        psVar1 = (storage_type_conflict *)(uVar15 + 10);
        string_00.m_size = local_e8.d.ptr + uVar15 + 10;
        string_00.m_data = psVar1;
        QtPrivate::convertToUtf8
                  (&local_128,(QtPrivate *)(local_e8.d.size + -(long)psVar1),string_00);
        goto LAB_00407992;
      }
    } while (((undefined1 *)local_e8.d.size != (undefined1 *)0x0) &&
            (bVar8 = 1 < lVar16, lVar16 = lVar16 + -1, bVar8));
    local_128.d.d = (Data *)0x0;
    local_128.d.ptr = (char *)0x0;
    local_128.d.size = 0;
LAB_00407992:
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_c8.st_dev != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_c8.st_dev)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_c8.st_dev)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_c8.st_dev)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_c8.st_dev,2,0x10);
      }
    }
    pQVar2 = (QArrayData *)*plVar11;
    pcVar4 = (char16_t *)plVar11[1];
    *plVar11 = (long)local_128.d.d;
    plVar11[1] = (long)local_128.d.ptr;
    puVar5 = (undefined1 *)plVar11[2];
    plVar11[2] = local_128.d.size;
    local_128.d.d = (Data *)pQVar2;
    local_128.d.ptr = (char *)pcVar4;
    local_128.d.size = (qsizetype)puVar5;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,1,0x10);
      }
    }
    lVar16 = plVar11[2];
    if (lVar16 == 0) {
      local_e8.d.d = (Data *)0x0;
      local_e8.d.ptr = L"/etc/TZ";
      local_e8.d.size = 7;
      anon_unknown.dwarf_13d8a16::ZoneNameReader::etcContent((QByteArray *)&local_c8,&local_e8);
      pQVar17 = (QArrayData *)*plVar11;
      pcVar20 = (char *)plVar11[1];
      *plVar11 = local_c8.st_dev;
      plVar11[1] = local_c8.st_ino;
      puVar5 = (undefined1 *)plVar11[2];
      plVar11[2] = local_c8.st_nlink;
      local_c8.st_dev = (__dev_t)pQVar17;
      local_c8.st_ino = (__ino64_t)pcVar20;
      local_c8.st_nlink = (__nlink_t)puVar5;
      if (pQVar17 != (QArrayData *)0x0) {
        LOCK();
        (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar17->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar17,1,0x10);
        }
      }
      if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar16 = plVar11[2];
      if (lVar16 == 0) {
        local_e8.d.d = (Data *)0x0;
        local_e8.d.ptr = L"/etc/timezone";
        local_e8.d.size = 0xd;
        anon_unknown.dwarf_13d8a16::ZoneNameReader::etcContent((QByteArray *)&local_c8,&local_e8);
        pQVar17 = (QArrayData *)*plVar11;
        pcVar20 = (char *)plVar11[1];
        *plVar11 = local_c8.st_dev;
        plVar11[1] = local_c8.st_ino;
        puVar5 = (undefined1 *)plVar11[2];
        plVar11[2] = local_c8.st_nlink;
        local_c8.st_dev = (__dev_t)pQVar17;
        local_c8.st_ino = (__ino64_t)pcVar20;
        local_c8.st_nlink = (__nlink_t)puVar5;
        if (pQVar17 != (QArrayData *)0x0) {
          LOCK();
          (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar17->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar17,1,0x10);
          }
        }
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
          }
        }
        lVar16 = plVar11[2];
        pcVar19 = (char *)(-(ulong)(lVar16 == 0) | (ulong)pcVar21);
        plVar11[3] = (ulong)pQVar22 | -(ulong)(lVar16 == 0);
      }
      else {
        plVar11[3] = (long)pQVar18;
      }
    }
    else {
      plVar11[3] = (long)pQVar17;
      pcVar19 = pcVar20;
    }
    plVar11[4] = (long)pcVar19;
  }
  else {
    pQVar2 = (QArrayData *)plVar11[3];
    pcVar3 = (char *)plVar11[4];
    if ((((ulong)pQVar2 & (ulong)pcVar3) == 0xffffffffffffffff) ||
       (((pcVar3 != pcVar20 || pQVar2 != pQVar17 && (pcVar3 != pcVar19 || pQVar2 != pQVar18)) &&
        (pcVar3 != pcVar21 || pQVar2 != pQVar22)))) goto LAB_0040775b;
  }
  pDVar6 = (Data *)*plVar11;
  pcVar20 = (char *)plVar11[1];
  if (pDVar6 != (Data *)0x0) {
    LOCK();
    (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar17 = &((in_RDI->d).d)->super_QArrayData;
  (in_RDI->d).d = pDVar6;
  (in_RDI->d).ptr = pcVar20;
  (in_RDI->d).size = lVar16;
  if (pQVar17 != (QArrayData *)0x0) {
    LOCK();
    (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar17->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar17,1,0x10);
    }
  }
LAB_004075af:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QTzTimeZonePrivate::staticSystemTimeZoneId()
{
    // Check TZ env var first, if not populated try find it
    QByteArray ianaId = qgetenv("TZ");

    // The TZ value can be ":/etc/localtime" which libc considers
    // to be a "default timezone", in which case it will be read
    // by one of the blocks below, so unset it here so it is not
    // considered as a valid/found ianaId
    if (ianaId == ":/etc/localtime")
        ianaId.clear();
    else if (ianaId.startsWith(':'))
        ianaId = ianaId.sliced(1);

    if (ianaId.isEmpty()) {
        Q_CONSTINIT thread_local static ZoneNameReader reader;
        ianaId = reader.name();
    }

    return ianaId;
}